

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivPrintOne(Gia_Man_t *p,int i,int Counter)

{
  Gia_Rpr_t GVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)i;
  uVar2 = Gia_ManEquivCountOne(p,i);
  Abc_Print(1,"Class %4d :  Num = %2d  {",(ulong)(uint)Counter,(ulong)uVar2);
  iVar3 = Gia_ObjIsHead(p,i);
  if (iVar3 == 0) {
    __assert_fail("Gia_ObjIsHead(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x1cb,"void Gia_ManEquivPrintOne(Gia_Man_t *, int, int)");
  }
  for (; 0 < (int)uVar4; uVar4 = (ulong)(uint)p->pNexts[uVar4]) {
    Abc_Print(1," %d",uVar4);
    GVar1 = p->pReprs[uVar4];
    if (0x3fffffff < (uint)GVar1) {
      Abc_Print(1," <%d%d>",(ulong)((uint)GVar1 >> 0x1e & 1),(ulong)((uint)GVar1 >> 0x1f));
    }
  }
  Abc_Print(1," }\n");
  return;
}

Assistant:

void Gia_ManEquivPrintOne( Gia_Man_t * p, int i, int Counter )
{
    int Ent;
    Abc_Print( 1, "Class %4d :  Num = %2d  {", Counter, Gia_ManEquivCountOne(p, i) );
    Gia_ClassForEachObj( p, i, Ent )
    {
        Abc_Print( 1," %d", Ent );
        if ( p->pReprs[Ent].fColorA || p->pReprs[Ent].fColorB )
            Abc_Print( 1," <%d%d>", p->pReprs[Ent].fColorA, p->pReprs[Ent].fColorB );
    }
    Abc_Print( 1, " }\n" );
}